

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

objc_protocol * objc_upgrade_protocol_gcc(objc_protocol_gcc *p)

{
  objc_protocol_method_description_list *poVar1;
  Protocol *proto;
  objc_protocol_gcc *p_local;
  
  if ((objc_class *)p->isa == &_OBJC_CLASS_ProtocolGCC) {
    p_local = (objc_protocol_gcc *)objc_getProtocol(p->name);
  }
  else {
    p->isa = (id)&_OBJC_CLASS_ProtocolGCC;
    p_local = (objc_protocol_gcc *)class_createInstance(&_OBJC_CLASS_Protocol,0);
    p_local->name = p->name;
    p_local->protocol_list = p->protocol_list;
    poVar1 = upgrade_protocol_method_list_gcc(p->instance_methods);
    p_local->instance_methods = (objc_protocol_method_description_list_gcc *)poVar1;
    poVar1 = upgrade_protocol_method_list_gcc(p->class_methods);
    p_local->class_methods = (objc_protocol_method_description_list_gcc *)poVar1;
    if ((Class)p_local->isa == (Class)0x0) {
      __assert_fail("proto->isa",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/legacy.c",
                    0x1ac,
                    "struct objc_protocol *objc_upgrade_protocol_gcc(struct objc_protocol_gcc *)");
    }
  }
  return (objc_protocol *)p_local;
}

Assistant:

objc_protocol *objc_upgrade_protocol_gcc(struct objc_protocol_gcc *p)
{
	// If the protocol has already been upgraded, the don't try to upgrade it twice.
	if (p->isa == (id)&_OBJC_CLASS_ProtocolGCC)
	{
		return objc_getProtocol(p->name);
	}
	p->isa = (id)&_OBJC_CLASS_ProtocolGCC;
	Protocol *proto =
		(Protocol*)class_createInstance(&_OBJC_CLASS_Protocol, 0);
	proto->name = p->name;
	// Aliasing of this between the new and old structures means that when this
	// returns these will all be updated.
	proto->protocol_list = p->protocol_list;
	proto->instance_methods = upgrade_protocol_method_list_gcc(p->instance_methods);
	proto->class_methods = upgrade_protocol_method_list_gcc(p->class_methods);
	assert(proto->isa);
	return proto;
}